

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O1

void __thiscall
QVarLengthArray<QLocaleId,_6LL>::push_back(QVarLengthArray<QLocaleId,_6LL> *this,QLocaleId *t)

{
  long in_FS_OFFSET;
  QLocaleId local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->super_QVLABase<QLocaleId>).super_QVLABaseBase.s ==
      (this->super_QVLABase<QLocaleId>).super_QVLABaseBase.a) {
    local_10.territory_id = t->territory_id;
    local_10.language_id = t->language_id;
    local_10.script_id = t->script_id;
    QVLABase<QLocaleId>::emplace_back_impl<QLocaleId>
              (&this->super_QVLABase<QLocaleId>,6,&this->super_QVLAStorage<6UL,_2UL,_6LL>,&local_10)
    ;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVLABase<QLocaleId>::emplace_back_impl<QLocaleId_const&>
              (&this->super_QVLABase<QLocaleId>,6,&this->super_QVLAStorage<6UL,_2UL,_6LL>,t);
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void push_back(const T &t) { append(t); }